

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImPool<ImPlotPlot>::Clear(ImPool<ImPlotPlot> *this)

{
  ImGuiStoragePair *pIVar1;
  ImPlotPlot *this_00;
  int local_14;
  int idx;
  int n;
  ImPool<ImPlotPlot> *this_local;
  
  for (local_14 = 0; local_14 < (this->Map).Data.Size; local_14 = local_14 + 1) {
    pIVar1 = ImVector<ImGuiStorage::ImGuiStoragePair>::operator[](&(this->Map).Data,local_14);
    if ((pIVar1->field_1).val_i != -1) {
      this_00 = ImVector<ImPlotPlot>::operator[](&this->Buf,(pIVar1->field_1).val_i);
      ImPlotPlot::~ImPlotPlot(this_00);
    }
  }
  ImGuiStorage::Clear(&this->Map);
  ImVector<ImPlotPlot>::clear(&this->Buf);
  this->AliveCount = 0;
  this->FreeIdx = 0;
  return;
}

Assistant:

void        Clear()                             { for (int n = 0; n < Map.Data.Size; n++) { int idx = Map.Data[n].val_i; if (idx != -1) Buf[idx].~T(); } Map.Clear(); Buf.clear(); FreeIdx = AliveCount = 0; }